

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

uint32_t elf_findsymidx(SymTabList *sl,char *name,uint16_t shndx)

{
  long lVar1;
  int iVar2;
  unsigned_long uVar3;
  short in_DX;
  char *in_RSI;
  long in_RDI;
  SymbolNode *sym;
  SymbolNode **chain;
  long *local_28;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  uVar3 = elf_hash(in_RSI);
  local_28 = (long *)(lVar1 + (uVar3 % *(ulong *)(in_RDI + 0x28)) * 8);
  while( true ) {
    lVar1 = *local_28;
    if (lVar1 == 0) {
      return 0;
    }
    iVar2 = strcmp(in_RSI,*(char **)(lVar1 + 0x20));
    if ((iVar2 == 0) && (*(short *)(lVar1 + 0x2c) == in_DX)) break;
    local_28 = (long *)(lVar1 + 0x10);
  }
  return *(uint32_t *)(lVar1 + 0x28);
}

Assistant:

static uint32_t elf_findsymidx(struct SymTabList *sl,const char *name,
                               uint16_t shndx)
/* find an ELF symbol by its name and shndx */
/* return its symbol table index, index=0 means 'not found' */
{
  struct SymbolNode **chain = &sl->hashtab[elf_hash(name) % sl->htabsize];
  struct SymbolNode *sym;

  while (sym = *chain) {
    if (!strcmp(name,sym->name) && sym->shndx==shndx)
      return sym->index;
    chain = &sym->hashchain;
  }
  return 0;
}